

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

X509_LOOKUP * X509_LOOKUP_new(X509_LOOKUP_METHOD *method)

{
  int iVar1;
  _func_int_X509_LOOKUP_ptr_int_char_ptr_long_char_ptr_ptr *in_RSI;
  X509_LOOKUP *ret;
  X509_STORE *store_local;
  X509_LOOKUP_METHOD *method_local;
  
  method_local = (X509_LOOKUP_METHOD *)OPENSSL_zalloc(0x18);
  if (method_local == (X509_LOOKUP_METHOD *)0x0) {
    method_local = (X509_LOOKUP_METHOD *)0x0;
  }
  else {
    method_local->new_item = (_func_int_X509_LOOKUP_ptr *)method;
    method_local->ctrl = in_RSI;
    if ((method->name != (char *)0x0) && (iVar1 = (*(code *)method->name)(method_local), iVar1 == 0)
       ) {
      OPENSSL_free(method_local);
      method_local = (X509_LOOKUP_METHOD *)0x0;
    }
  }
  return (X509_LOOKUP *)method_local;
}

Assistant:

static X509_LOOKUP *X509_LOOKUP_new(const X509_LOOKUP_METHOD *method,
                                    X509_STORE *store) {
  X509_LOOKUP *ret =
      reinterpret_cast<X509_LOOKUP *>(OPENSSL_zalloc(sizeof(X509_LOOKUP)));
  if (ret == NULL) {
    return NULL;
  }

  ret->method = method;
  ret->store_ctx = store;
  if (method->new_item != NULL && !method->new_item(ret)) {
    OPENSSL_free(ret);
    return NULL;
  }
  return ret;
}